

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O2

drwav_bool32
drwav_preinit(drwav *pWav,drwav_read_proc onRead,drwav_seek_proc onSeek,void *pReadSeekUserData,
             drwav_allocation_callbacks *pAllocationCallbacks)

{
  code *pcVar1;
  code *pcVar2;
  code *pcVar3;
  drwav_bool32 dVar4;
  void *pvVar5;
  
  dVar4 = 0;
  if (onSeek != (drwav_seek_proc)0x0 && (onRead != (drwav_read_proc)0x0 && pWav != (drwav *)0x0)) {
    dVar4 = 0;
    memset(&pWav->onWrite,0,0x1b0);
    pWav->onRead = onRead;
    pWav->onSeek = onSeek;
    pWav->pUserData = pReadSeekUserData;
    if (pAllocationCallbacks == (drwav_allocation_callbacks *)0x0) {
      pcVar1 = drwav__malloc_default;
      pcVar2 = drwav__realloc_default;
      pcVar3 = drwav__free_default;
      pvVar5 = (void *)0x0;
    }
    else {
      pvVar5 = pAllocationCallbacks->pUserData;
      pcVar1 = pAllocationCallbacks->onMalloc;
      pcVar2 = pAllocationCallbacks->onRealloc;
      pcVar3 = pAllocationCallbacks->onFree;
    }
    (pWav->allocationCallbacks).pUserData = pvVar5;
    (pWav->allocationCallbacks).onMalloc = pcVar1;
    (pWav->allocationCallbacks).onRealloc = pcVar2;
    (pWav->allocationCallbacks).onFree = pcVar3;
    if (pcVar3 != (_func_void_void_ptr_void_ptr *)0x0) {
      dVar4 = (drwav_bool32)
              (pcVar1 != (_func_void_ptr_size_t_void_ptr *)0x0 ||
              pcVar2 != (_func_void_ptr_void_ptr_size_t_void_ptr *)0x0);
    }
  }
  return dVar4;
}

Assistant:

static drwav_bool32 drwav_preinit(drwav* pWav, drwav_read_proc onRead, drwav_seek_proc onSeek, void* pReadSeekUserData, const drwav_allocation_callbacks* pAllocationCallbacks)
{
    if (pWav == NULL || onRead == NULL || onSeek == NULL) {
        return DRWAV_FALSE;
    }

    DRWAV_ZERO_MEMORY(pWav, sizeof(*pWav));
    pWav->onRead    = onRead;
    pWav->onSeek    = onSeek;
    pWav->pUserData = pReadSeekUserData;
    pWav->allocationCallbacks = drwav_copy_allocation_callbacks_or_defaults(pAllocationCallbacks);

    if (pWav->allocationCallbacks.onFree == NULL || (pWav->allocationCallbacks.onMalloc == NULL && pWav->allocationCallbacks.onRealloc == NULL)) {
        return DRWAV_FALSE;    /* Invalid allocation callbacks. */
    }

    return DRWAV_TRUE;
}